

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O1

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::UniqueConstraint::Deserialize(UniqueConstraint *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  UniqueConstraint *this_00;
  pointer pUVar4;
  undefined4 extraout_var;
  pointer *__ptr;
  unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true> result;
  _Head_base<0UL,_duckdb::UniqueConstraint_*,_false> local_28;
  int iVar3;
  
  this_00 = (UniqueConstraint *)operator_new(0x38);
  UniqueConstraint(this_00);
  local_28._M_head_impl = this_00;
  pUVar4 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                         *)&local_28);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"is_primary_key");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pUVar4->is_primary_key = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pUVar4 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                         *)&local_28);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"index");
  iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  (pUVar4->index).index = CONCAT44(extraout_var,iVar3);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pUVar4 = unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
           ::operator->((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xca,"columns",&pUVar4->columns);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> UniqueConstraint::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<UniqueConstraint>(new UniqueConstraint());
	deserializer.ReadPropertyWithDefault<bool>(200, "is_primary_key", result->is_primary_key);
	deserializer.ReadProperty<LogicalIndex>(201, "index", result->index);
	deserializer.ReadPropertyWithDefault<vector<string>>(202, "columns", result->columns);
	return std::move(result);
}